

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseName(State *state)

{
  undefined1 *puVar1;
  ParseState *pPVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ComplexityGuard guard;
  bool bVar13;
  ParseState copy;
  int local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  iVar11 = iVar3 + 1;
  state->recursion_depth = iVar11;
  state->steps = iVar4 + 1;
  if (0x1ffff < iVar4 || 0xff < iVar3) {
    bVar13 = false;
    goto LAB_00265493;
  }
  iVar11 = iVar3 + 2;
  state->recursion_depth = iVar11;
  iVar12 = iVar4 + 2;
  state->steps = iVar12;
  if (iVar4 < 0x1ffff && iVar3 < 0xff) {
    iVar11 = (state->parse_state).prev_name_idx;
    iVar3 = (state->parse_state).mangled_idx;
    iVar4 = (state->parse_state).out_cur_idx;
    uVar5 = *(uint *)&(state->parse_state).field_0xc;
    bVar10 = ParseOneCharToken(state,'N');
    if (!bVar10) {
LAB_00265249:
      (state->parse_state).prev_name_idx = iVar11;
      (state->parse_state).mangled_idx = iVar3;
      (state->parse_state).out_cur_idx = iVar4;
      *(uint *)&(state->parse_state).field_0xc = uVar5;
      iVar11 = state->recursion_depth;
      iVar12 = state->steps;
      goto LAB_00265264;
    }
    puVar1 = &(state->parse_state).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0x8000ffff;
    ParseCVQualifiers(state);
    ParseCharClass(state,"OR");
    bVar10 = ParsePrefix(state);
    if (!bVar10) goto LAB_00265249;
    *(uint *)&(state->parse_state).field_0xc =
         *(uint *)&(state->parse_state).field_0xc & 0x8000ffff | uVar5 & 0x7fff0000;
    bVar10 = ParseOneCharToken(state,'E');
    if (!bVar10) goto LAB_00265249;
    iVar11 = state->recursion_depth + -1;
LAB_00265424:
    state->recursion_depth = iVar11;
    bVar13 = true;
    goto LAB_00265493;
  }
LAB_00265264:
  state->steps = iVar12 + 1;
  if (iVar12 < 0x20000 && iVar11 < 0x101) {
    pPVar2 = &state->parse_state;
    local_38._0_4_ = (state->parse_state).mangled_idx;
    local_38._4_4_ = (state->parse_state).out_cur_idx;
    uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar10 = ParseOneCharToken(state,'Z');
    if (bVar10) {
      bVar10 = ParseEncoding(state);
      if (bVar10) {
        bVar10 = ParseOneCharToken(state,'E');
        if (bVar10) {
          iVar11 = state->recursion_depth;
          iVar3 = state->steps;
          state->recursion_depth = iVar11 + 1;
          state->steps = iVar3 + 1;
          if (iVar3 < 0x20000 && iVar11 < 0x100) {
            uVar6 = pPVar2->mangled_idx;
            uVar7 = pPVar2->out_cur_idx;
            uVar8 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar10 = ParseOneCharToken(state,'d');
            if ((bVar10) &&
               (state->mangled_begin[(state->parse_state).mangled_idx] == '_' ||
                (byte)(state->mangled_begin[(state->parse_state).mangled_idx] - 0x30U) < 10)) {
              local_3c = -1;
              ParseNumber(state,&local_3c);
              uVar5 = local_3c + 0x80000002;
              iVar11 = local_3c + 2;
              local_3c = 1;
              if (0x80000000 < uVar5) {
                local_3c = iVar11;
              }
              MaybeAppend(state,"::{default arg#");
              MaybeAppendDecimal(state,local_3c);
              MaybeAppend(state,"}::");
              bVar10 = ParseOneCharToken(state,'_');
              if (bVar10) {
                bVar10 = ParseName(state);
                if (bVar10) goto LAB_0026541e;
              }
              pPVar2->mangled_idx = uVar6;
              pPVar2->out_cur_idx = uVar7;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar8;
              if (*(int *)&(state->parse_state).field_0xc < 0) {
                state->out[(state->parse_state).out_cur_idx] = '\0';
              }
            }
            else {
              pPVar2->mangled_idx = uVar6;
              pPVar2->out_cur_idx = uVar7;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar8;
              MaybeAppend(state,"::");
              bVar10 = ParseName(state);
              if (bVar10) {
LAB_00265416:
                ParseDiscriminator(state);
LAB_0026541e:
                iVar11 = state->recursion_depth + -2;
                goto LAB_00265424;
              }
              pPVar2->mangled_idx = uVar6;
              pPVar2->out_cur_idx = uVar7;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar8;
              if (*(int *)&(state->parse_state).field_0xc < 0) {
                state->out[(state->parse_state).out_cur_idx] = '\0';
              }
              bVar10 = ParseOneCharToken(state,'s');
              if (bVar10) goto LAB_00265416;
            }
            iVar11 = state->recursion_depth + -1;
          }
          state->recursion_depth = iVar11;
        }
      }
    }
    pPVar2->mangled_idx = (undefined4)local_38;
    pPVar2->out_cur_idx = local_38._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
    iVar11 = state->recursion_depth;
  }
  state->recursion_depth = iVar11 + -1;
  iVar11 = (state->parse_state).mangled_idx;
  iVar3 = (state->parse_state).out_cur_idx;
  iVar4 = (state->parse_state).prev_name_idx;
  uVar9 = *(undefined4 *)&(state->parse_state).field_0xc;
  bVar10 = ParseSubstitution(state,false);
  if (bVar10) {
    bVar10 = ParseTemplateArgs(state);
    bVar13 = true;
    if (!bVar10) goto LAB_0026546a;
  }
  else {
LAB_0026546a:
    (state->parse_state).mangled_idx = iVar11;
    (state->parse_state).out_cur_idx = iVar3;
    (state->parse_state).prev_name_idx = iVar4;
    *(undefined4 *)&(state->parse_state).field_0xc = uVar9;
    bVar10 = ParseUnscopedName(state);
    if (bVar10) {
      bVar13 = true;
      ParseTemplateArgs(state);
    }
    else {
      bVar13 = false;
    }
  }
  iVar11 = state->recursion_depth;
LAB_00265493:
  state->recursion_depth = iVar11 + -1;
  return bVar13;
}

Assistant:

static bool ParseName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseNestedName(state) || ParseLocalName(state)) {
    return true;
  }

  // We reorganize the productions to avoid re-parsing unscoped names.
  // - Inline <unscoped-template-name> productions:
  //   <name> ::= <substitution> <template-args>
  //          ::= <unscoped-name> <template-args>
  //          ::= <unscoped-name>
  // - Merge the two productions that start with unscoped-name:
  //   <name> ::= <unscoped-name> [<template-args>]

  ParseState copy = state->parse_state;
  // "std<...>" isn't a valid name.
  if (ParseSubstitution(state, /*accept_std=*/false) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Note there's no need to restore state after this since only the first
  // subparser can fail.
  return ParseUnscopedName(state) && Optional(ParseTemplateArgs(state));
}